

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::setErrorState
          (QSocks5SocketEnginePrivate *this,Socks5State state,Socks5Error socks5error)

{
  QSocks5SocketEngine *pQVar1;
  undefined4 in_EDX;
  QSocks5SocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  QSocks5SocketEngine *q;
  int in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  QString *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  QChar fillChar;
  Socks5State in_stack_fffffffffffffeec;
  QSocks5SocketEnginePrivate *in_stack_fffffffffffffef0;
  QChar local_fa [121];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  fillChar.ucs = (char16_t)((ulong)pQVar1 >> 0x30);
  switch(in_EDX) {
  case 1:
    QSocks5SocketEngine::tr
              ((char *)in_stack_fffffffffffffe68,
               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x3702b3);
    break;
  case 2:
    QSocks5SocketEngine::tr
              ((char *)in_stack_fffffffffffffe68,
               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x370303);
    break;
  case 3:
    QAbstractSocket::tr((char *)in_stack_fffffffffffffe68,
                        (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x370353);
    break;
  case 4:
    QAbstractSocket::tr((char *)in_stack_fffffffffffffe68,
                        (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x3703a3);
    break;
  case 5:
    QAbstractSocket::tr((char *)in_stack_fffffffffffffe68,
                        (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x3703f0);
    break;
  case 6:
    QSocks5SocketEngine::tr
              ((char *)in_stack_fffffffffffffe68,
               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x370440);
    break;
  case 7:
    QSocks5SocketEngine::tr
              ((char *)in_stack_fffffffffffffe68,
               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x370490);
    break;
  case 8:
    QSocks5SocketEngine::tr
              ((char *)in_stack_fffffffffffffe68,
               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x3704e0);
    break;
  default:
    QSocks5SocketEngine::tr
              ((char *)in_stack_fffffffffffffe68,
               (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    QChar::QChar<char16_t,_true>(local_fa,L' ');
    QString::arg<int,_true>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe5c,fillChar);
    QAbstractSocketEngine::setError
              ((QAbstractSocketEngine *)CONCAT44(in_EDX,in_stack_fffffffffffffe70),
               (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x37057a);
    QString::~QString((QString *)0x370587);
  }
  QString::QString((QString *)0x3705a4);
  setErrorState(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(QString *)in_RDI);
  QString::~QString((QString *)0x3705c1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::setErrorState(Socks5State state, Socks5Error socks5error)
{
    Q_Q(QSocks5SocketEngine);
    switch (socks5error) {
    case SocksFailure:
        q->setError(QAbstractSocket::NetworkError,
                     QSocks5SocketEngine::tr("General SOCKSv5 server failure"));
        break;
    case ConnectionNotAllowed:
        q->setError(QAbstractSocket::SocketAccessError,
                     QSocks5SocketEngine::tr("Connection not allowed by SOCKSv5 server"));
        break;
    case NetworkUnreachable:
        q->setError(QAbstractSocket::NetworkError,
                    QAbstractSocket::tr("Network unreachable"));
        break;
    case HostUnreachable:
        q->setError(QAbstractSocket::HostNotFoundError,
                    QAbstractSocket::tr("Host not found"));
        break;
    case ConnectionRefused:
        q->setError(QAbstractSocket::ConnectionRefusedError,
                    QAbstractSocket::tr("Connection refused"));
        break;
    case TTLExpired:
        q->setError(QAbstractSocket::NetworkError,
                     QSocks5SocketEngine::tr("TTL expired"));
        break;
    case CommandNotSupported:
        q->setError(QAbstractSocket::UnsupportedSocketOperationError,
                     QSocks5SocketEngine::tr("SOCKSv5 command not supported"));
        break;
    case AddressTypeNotSupported:
        q->setError(QAbstractSocket::UnsupportedSocketOperationError,
                     QSocks5SocketEngine::tr("Address type not supported"));
        break;

    default:
        q->setError(QAbstractSocket::UnknownSocketError,
                     QSocks5SocketEngine::tr("Unknown SOCKSv5 proxy error code 0x%1").arg(int(socks5error), 16));
        break;
    }

    setErrorState(state, QString());
}